

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O0

void __thiscall LCA_LCA_Test::TestBody(LCA_LCA_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  int bb;
  int aa;
  int b;
  int a;
  int tests;
  int n;
  LCA_LCA_Test *this_local;
  
  for (b = 0; b < 10; b = b + 1) {
    generateTree(0x32);
    initLCA(0,0x32);
    for (aa = 0; aa < 0x32; aa = aa + 1) {
      for (bb = 0; bb < 0x32; bb = bb + 1) {
        gtest_ar.message_.ptr_._4_4_ = aa;
        gtest_ar.message_.ptr_._0_4_ = bb;
        while (gtest_ar.message_.ptr_._4_4_ != (int)gtest_ar.message_.ptr_) {
          if (d[gtest_ar.message_.ptr_._4_4_] < d[(int)gtest_ar.message_.ptr_]) {
            gtest_ar.message_.ptr_._0_4_ = pred[(int)gtest_ar.message_.ptr_][0];
          }
          else {
            gtest_ar.message_.ptr_._4_4_ = pred[gtest_ar.message_.ptr_._4_4_][0];
          }
        }
        local_3c = lca(aa,bb);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_38,"aa","lca(a, b)",
                   (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_3c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
        if (!bVar1) {
          testing::Message::Message(local_58);
          message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/lca_test.cpp"
                     ,0x42,message);
          testing::internal::AssertHelper::operator=(&local_60,local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          testing::Message::~Message(local_58);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
      }
    }
  }
  return;
}

Assistant:

TEST(LCA, LCA) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        initLCA(0, n);
        rep(a, 0, n) rep(b, 0, n) {
            int aa = a, bb = b;
            while (aa != bb) {
                if (d[aa] >= d[bb]) {
                    aa = pred[aa][0];
                } else {
                    bb = pred[bb][0];
                }
            }
            EXPECT_EQ(aa, lca(a, b));
        }
    }
}